

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall QMultiHash<int,_int>::detach_helper(QMultiHash<int,_int> *this)

{
  Data<QHashPrivate::MultiNode<int,_int>_> *pDVar1;
  Data *pDVar2;
  Data<QHashPrivate::MultiNode<int,_int>_> *this_00;
  
  pDVar1 = this->d;
  this_00 = (Data<QHashPrivate::MultiNode<int,_int>_> *)operator_new(0x28);
  if (pDVar1 == (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0) {
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Data(this_00,0);
  }
  else {
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Data(this_00,pDVar1);
    pDVar2 = this->d;
    if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar1 = this->d;
        if (pDVar1 != (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0) {
          QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::~Data(pDVar1);
        }
        operator_delete(pDVar1,0x28);
      }
    }
  }
  this->d = this_00;
  return;
}

Assistant:

void detach_helper()
    {
        if (!d) {
            d = new Data;
            return;
        }
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        d = dd;
    }